

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

int markbuffer(int f,int n)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = gotoeob(f,n);
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  else {
    clearmark(f,n);
    iVar1 = gotobob(f,n);
    uVar2 = (uint)(iVar1 != 0);
  }
  return uVar2;
}

Assistant:

int
markbuffer(int f, int n)
{
	if (gotoeob(f,n) == FALSE)
		return (FALSE);
	(void) clearmark(f, n);
	if (gotobob(f,n) == FALSE)
		return (FALSE);
	return (TRUE);
}